

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_CCtxParams_getParameter(ZSTD_CCtx_params *CCtxParams,ZSTD_cParameter param,int *value)

{
  ulong uVar1;
  
  if ((int)param < 200) {
    switch(param) {
    case ZSTD_c_compressionLevel:
      uVar1 = (ulong)(uint)CCtxParams->compressionLevel;
      break;
    case ZSTD_c_windowLog:
      uVar1 = (ulong)(CCtxParams->cParams).windowLog;
      break;
    case ZSTD_c_hashLog:
      uVar1 = (ulong)(CCtxParams->cParams).hashLog;
      break;
    case ZSTD_c_chainLog:
      uVar1 = (ulong)(CCtxParams->cParams).chainLog;
      break;
    case ZSTD_c_searchLog:
      uVar1 = (ulong)(CCtxParams->cParams).searchLog;
      break;
    case ZSTD_c_minMatch:
      uVar1 = (ulong)(CCtxParams->cParams).minMatch;
      break;
    case ZSTD_c_targetLength:
      uVar1 = (ulong)(CCtxParams->cParams).targetLength;
      break;
    case ZSTD_c_strategy:
      uVar1 = (ulong)(CCtxParams->cParams).strategy;
      break;
    default:
      switch(param) {
      case ZSTD_c_enableLongDistanceMatching:
        uVar1 = (ulong)(CCtxParams->ldmParams).enableLdm;
        break;
      case ZSTD_c_ldmHashLog:
        uVar1 = (ulong)(CCtxParams->ldmParams).hashLog;
        break;
      case ZSTD_c_ldmMinMatch:
        uVar1 = (ulong)(CCtxParams->ldmParams).minMatchLength;
        break;
      case ZSTD_c_ldmBucketSizeLog:
        uVar1 = (ulong)(CCtxParams->ldmParams).bucketSizeLog;
        break;
      case ZSTD_c_ldmHashRateLog:
        uVar1 = (ulong)(CCtxParams->ldmParams).hashRateLog;
        break;
      default:
        if (param != ZSTD_c_experimentalParam2) {
          return 0xffffffffffffffd8;
        }
        uVar1 = (ulong)CCtxParams->format;
      }
    }
  }
  else if ((int)param < 0x192) {
    if ((int)param < 0xca) {
      if (param == ZSTD_c_contentSizeFlag) {
        uVar1 = (ulong)(uint)(CCtxParams->fParams).contentSizeFlag;
      }
      else {
        if (param != ZSTD_c_checksumFlag) {
          return 0xffffffffffffffd8;
        }
        uVar1 = (ulong)(uint)(CCtxParams->fParams).checksumFlag;
      }
    }
    else if (param == ZSTD_c_dictIDFlag) {
      uVar1 = (ulong)((CCtxParams->fParams).noDictIDFlag == 0);
    }
    else if (param == ZSTD_c_nbWorkers) {
      uVar1 = (ulong)(uint)CCtxParams->nbWorkers;
    }
    else {
      if (param != ZSTD_c_jobSize) {
        return 0xffffffffffffffd8;
      }
      uVar1 = CCtxParams->jobSize;
      if ((uVar1 & 0xffffffff80000000) != 0) {
        __assert_fail("CCtxParams->jobSize <= INT_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x2d54,
                      "size_t ZSTD_CCtxParams_getParameter(ZSTD_CCtx_params *, ZSTD_cParameter, int *)"
                     );
      }
    }
  }
  else {
    switch(param) {
    case ZSTD_c_experimentalParam3:
      uVar1 = (ulong)(uint)CCtxParams->forceWindow;
      break;
    case ZSTD_c_experimentalParam4:
      uVar1 = (ulong)CCtxParams->attachDictPref;
      break;
    case ZSTD_c_experimentalParam5:
      uVar1 = (ulong)CCtxParams->literalCompressionMode;
      break;
    case ZSTD_c_experimentalParam6:
      uVar1 = (ulong)(uint)CCtxParams->targetCBlockSize;
      break;
    case ZSTD_c_experimentalParam7:
      uVar1 = (ulong)(uint)CCtxParams->srcSizeHint;
      break;
    default:
      if (param == ZSTD_c_overlapLog) {
        uVar1 = (ulong)(uint)CCtxParams->overlapLog;
      }
      else {
        if (param != ZSTD_c_experimentalParam1) {
          return 0xffffffffffffffd8;
        }
        uVar1 = (ulong)(uint)CCtxParams->rsyncable;
      }
    }
  }
  *value = (int)uVar1;
  return 0;
}

Assistant:

size_t ZSTD_CCtxParams_getParameter(
        ZSTD_CCtx_params* CCtxParams, ZSTD_cParameter param, int* value)
{
    switch(param)
    {
    case ZSTD_c_format :
        *value = CCtxParams->format;
        break;
    case ZSTD_c_compressionLevel :
        *value = CCtxParams->compressionLevel;
        break;
    case ZSTD_c_windowLog :
        *value = (int)CCtxParams->cParams.windowLog;
        break;
    case ZSTD_c_hashLog :
        *value = (int)CCtxParams->cParams.hashLog;
        break;
    case ZSTD_c_chainLog :
        *value = (int)CCtxParams->cParams.chainLog;
        break;
    case ZSTD_c_searchLog :
        *value = CCtxParams->cParams.searchLog;
        break;
    case ZSTD_c_minMatch :
        *value = CCtxParams->cParams.minMatch;
        break;
    case ZSTD_c_targetLength :
        *value = CCtxParams->cParams.targetLength;
        break;
    case ZSTD_c_strategy :
        *value = (unsigned)CCtxParams->cParams.strategy;
        break;
    case ZSTD_c_contentSizeFlag :
        *value = CCtxParams->fParams.contentSizeFlag;
        break;
    case ZSTD_c_checksumFlag :
        *value = CCtxParams->fParams.checksumFlag;
        break;
    case ZSTD_c_dictIDFlag :
        *value = !CCtxParams->fParams.noDictIDFlag;
        break;
    case ZSTD_c_forceMaxWindow :
        *value = CCtxParams->forceWindow;
        break;
    case ZSTD_c_forceAttachDict :
        *value = CCtxParams->attachDictPref;
        break;
    case ZSTD_c_literalCompressionMode :
        *value = CCtxParams->literalCompressionMode;
        break;
    case ZSTD_c_nbWorkers :
#ifndef ZSTD_MULTITHREAD
        assert(CCtxParams->nbWorkers == 0);
#endif
        *value = CCtxParams->nbWorkers;
        break;
    case ZSTD_c_jobSize :
#ifndef ZSTD_MULTITHREAD
        RETURN_ERROR(parameter_unsupported, "not compiled with multithreading");
#else
        assert(CCtxParams->jobSize <= INT_MAX);
        *value = (int)CCtxParams->jobSize;
        break;
#endif
    case ZSTD_c_overlapLog :
#ifndef ZSTD_MULTITHREAD
        RETURN_ERROR(parameter_unsupported, "not compiled with multithreading");
#else
        *value = CCtxParams->overlapLog;
        break;
#endif
    case ZSTD_c_rsyncable :
#ifndef ZSTD_MULTITHREAD
        RETURN_ERROR(parameter_unsupported, "not compiled with multithreading");
#else
        *value = CCtxParams->rsyncable;
        break;
#endif
    case ZSTD_c_enableLongDistanceMatching :
        *value = CCtxParams->ldmParams.enableLdm;
        break;
    case ZSTD_c_ldmHashLog :
        *value = CCtxParams->ldmParams.hashLog;
        break;
    case ZSTD_c_ldmMinMatch :
        *value = CCtxParams->ldmParams.minMatchLength;
        break;
    case ZSTD_c_ldmBucketSizeLog :
        *value = CCtxParams->ldmParams.bucketSizeLog;
        break;
    case ZSTD_c_ldmHashRateLog :
        *value = CCtxParams->ldmParams.hashRateLog;
        break;
    case ZSTD_c_targetCBlockSize :
        *value = (int)CCtxParams->targetCBlockSize;
        break;
    case ZSTD_c_srcSizeHint :
        *value = (int)CCtxParams->srcSizeHint;
        break;
    default: RETURN_ERROR(parameter_unsupported, "unknown parameter");
    }
    return 0;
}